

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

void __thiscall Shader::compile(Shader *this,char *vert_src,char *frag_src,char *geom_src)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  GLuint GVar4;
  tm *ptVar5;
  size_t sVar6;
  ostream *poVar7;
  uint32_t uVar8;
  Shader *pSVar9;
  uint32_t uVar10;
  time_t rawtime;
  char local_3e [2];
  uint32_t local_3c;
  time_t local_38;
  
  local_38 = time((time_t *)0x0);
  ptVar5 = localtime(&local_38);
  sprintf(ta,"[%02d:%02d:%02d]: ",(ulong)(uint)ptVar5->tm_hour,(ulong)(uint)ptVar5->tm_min,
          (ulong)(uint)ptVar5->tm_sec);
  sVar6 = strlen(ta);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,ta,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Compiling sources: ",0x13);
  if (vert_src == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1c6828);
  }
  else {
    sVar6 = strlen(vert_src);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,vert_src,sVar6);
  }
  local_3e[0] = ' ';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_3e,1);
  if (frag_src == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar6 = strlen(frag_src);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,frag_src,sVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  sVar6 = strlen(ta);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logFile,ta,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logFile,"Compiling sources: ",0x13)
  ;
  if (vert_src == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(logFile + -0x18) + 0x1bd898);
  }
  else {
    sVar6 = strlen(vert_src);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logFile,vert_src,sVar6);
  }
  local_3e[1] = 0x20;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logFile,local_3e + 1,1);
  if (frag_src == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar6 = strlen(frag_src);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,frag_src,sVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  uVar2 = create_shader(this,vert_src,0x8b31);
  uVar3 = create_shader(this,frag_src,0x8b30);
  if (geom_src != (char *)0x0) {
    local_3c = create_shader(this,geom_src,0x8dd9);
  }
  GVar4 = (*glad_glCreateProgram)();
  this->m_id = GVar4;
  (*glad_glAttachShader)(GVar4,uVar2);
  (*glad_glAttachShader)(this->m_id,uVar3);
  uVar10 = local_3c;
  uVar1 = this->m_id;
  pSVar9 = (Shader *)(ulong)uVar1;
  if (geom_src == (char *)0x0) {
    (*glad_glLinkProgram)(uVar1);
    check_errors(pSVar9,this->m_id,2);
    uVar8 = uVar2;
    uVar10 = uVar3;
  }
  else {
    (*glad_glAttachShader)(uVar1,local_3c);
    pSVar9 = (Shader *)(ulong)this->m_id;
    (*glad_glLinkProgram)(this->m_id);
    check_errors(pSVar9,this->m_id,2);
    (*glad_glDeleteShader)(uVar2);
    uVar8 = uVar3;
  }
  (*glad_glDeleteShader)(uVar8);
  (*glad_glDeleteShader)(uVar10);
  (*glad_glDetachShader)(this->m_id,uVar2);
  (*glad_glDetachShader)(this->m_id,uVar3);
  if (geom_src != (char *)0x0) {
    (*glad_glDetachShader)(this->m_id,local_3c);
  }
  return;
}

Assistant:

void Shader::compile(const char *vert_src, const char *frag_src, const char *geom_src)
{
    LOG_INFO("Compiling sources: " << vert_src << ' ' << frag_src);
    GLuint sh_vert, sh_frag, sh_geom;

    // Vertex shader
    sh_vert = create_shader(vert_src, GL_VERTEX_SHADER);
    // Fragment shader
    sh_frag = create_shader(frag_src, GL_FRAGMENT_SHADER);
    // Geometry shader
    if (geom_src != nullptr)
        sh_geom = create_shader(geom_src, GL_GEOMETRY_SHADER);
    
    // Create program
    m_id = glCreateProgram();

    // Attach shaders
    glAttachShader(m_id, sh_vert);
    glAttachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glAttachShader(m_id, sh_geom);

    // Link the program and check for any link errors
    glLinkProgram(m_id);
    check_errors(m_id, LINK_ERRORS);

    // Clean up after linked, no longer needed
    glDeleteShader(sh_vert);
    glDeleteShader(sh_frag);
    if (geom_src != nullptr)
        glDeleteShader(sh_geom);

    glDetachShader(m_id, sh_vert);
    glDetachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glDetachShader(m_id, sh_geom);
}